

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

LinearSpace3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID,BBox1f time_range)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  float fVar12;
  vfloat4 b1;
  undefined1 auVar13 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  vfloat4 a0;
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = time_range;
  BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  auVar13._8_8_ = 0;
  auVar13._0_4_ = BVar1.lower;
  auVar13._4_4_ = BVar1.upper;
  fVar19 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  fVar12 = BVar1.lower;
  auVar13 = vmovshdup_avx(auVar13);
  fVar29 = auVar13._0_4_ - fVar12;
  auVar9 = vmovshdup_avx(auVar11._0_16_);
  auVar13 = ZEXT416((uint)(fVar19 * ((time_range.lower - fVar12) / fVar29) * 1.0000002));
  auVar13 = vroundss_avx(auVar13,auVar13,9);
  auVar13 = vmaxss_avx(ZEXT816(0),auVar13);
  auVar9 = ZEXT416((uint)(fVar19 * ((auVar9._0_4_ - fVar12) / fVar29) * 0.99999976));
  auVar9 = vroundss_avx(auVar9,auVar9,10);
  auVar9 = vminss_avx(auVar9,ZEXT416((uint)fVar19));
  if ((int)auVar9._0_4_ == (int)auVar13._0_4_) {
    auVar13 = vdpps_avx(_DAT_020214e0,_DAT_020214e0,0x7f);
    auVar10 = SUB6416(ZEXT464(0xbf800000),0);
    auVar9 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar13 = vcmpps_avx(auVar9,auVar13,1);
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    auVar13 = vblendvps_avx(auVar10,_DAT_020214e0,auVar13);
    auVar9 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar10 = vrsqrtss_avx(auVar9,auVar9);
    fVar19 = auVar10._0_4_;
    auVar9 = ZEXT416((uint)(fVar19 * 1.5 - auVar9._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
    auVar9 = vshufps_avx(auVar9,auVar9,0);
    aVar14._0_4_ = auVar13._0_4_ * auVar9._0_4_;
    aVar14._4_4_ = auVar13._4_4_ * auVar9._4_4_;
    aVar14._8_4_ = auVar13._8_4_ * auVar9._8_4_;
    aVar14._12_4_ = auVar13._12_4_ * auVar9._12_4_;
    auVar20._0_4_ = aVar14._0_4_ * 1.0;
    auVar20._4_4_ = aVar14._4_4_ * 0.0;
    auVar20._8_4_ = aVar14._8_4_ * 0.0;
    auVar20._12_4_ = aVar14._12_4_ * 0.0;
    auVar13 = vshufps_avx((undefined1  [16])aVar14,(undefined1  [16])aVar14,0xc9);
    auVar10._0_4_ = auVar13._0_4_ * 1.0;
    auVar10._4_4_ = auVar13._4_4_ * 0.0;
    auVar10._8_4_ = auVar13._8_4_ * 0.0;
    auVar10._12_4_ = auVar13._12_4_ * 0.0;
    auVar13 = vshufps_avx(auVar20,auVar20,0xd2);
    auVar10 = vsubps_avx(auVar13,auVar10);
    auVar13 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar9 = vrsqrtss_avx(auVar13,auVar13);
    fVar19 = auVar9._0_4_;
    auVar13 = ZEXT416((uint)(fVar19 * 1.5 - auVar13._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
    auVar13 = vshufps_avx(auVar13,auVar13,0);
    aVar21._0_4_ = auVar13._0_4_ * auVar10._0_4_;
    aVar21._4_4_ = auVar13._4_4_ * auVar10._4_4_;
    aVar21._8_4_ = auVar13._8_4_ * auVar10._8_4_;
    aVar21._12_4_ = auVar13._12_4_ * auVar10._12_4_;
    auVar9 = _DAT_01fec700;
  }
  else {
    iVar6 = ((int)auVar13._0_4_ + (int)auVar9._0_4_) / 2;
    pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar4 = pBVar3[iVar6].super_RawBufferView.ptr_ofs;
    sVar5 = pBVar3[iVar6].super_RawBufferView.stride;
    lVar7 = (uVar2 + 1) * sVar5;
    lVar8 = (uVar2 + 2) * sVar5;
    fVar19 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             maxRadiusScale;
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                            ZEXT416((uint)(fVar19 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
    auVar20 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar8),
                            ZEXT416((uint)(fVar19 * *(float *)(pcVar4 + lVar8 + 0xc))),0x30);
    auVar15 = vsubps_avx(auVar20,auVar10);
    auVar13 = vdpps_avx(auVar15,auVar15,0x7f);
    auVar9 = vrsqrtss_avx(auVar13,auVar13);
    fVar29 = auVar9._0_4_;
    lVar7 = (uVar2 + 3) * sVar5;
    auVar9 = ZEXT416((uint)(fVar29 * 1.5 - auVar13._0_4_ * 0.5 * fVar29 * fVar29 * fVar29));
    auVar16 = vshufps_avx(auVar9,auVar9,0);
    auVar9._0_4_ = auVar15._0_4_ * auVar16._0_4_;
    auVar9._4_4_ = auVar15._4_4_ * auVar16._4_4_;
    auVar9._8_4_ = auVar15._8_4_ * auVar16._8_4_;
    auVar9._12_4_ = auVar15._12_4_ * auVar16._12_4_;
    if (1e-18 < auVar13._0_4_) {
      auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5),
                              ZEXT416((uint)(fVar19 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc))),
                              0x30);
      auVar16 = vinsertps_avx(*(undefined1 (*) [16])(pcVar4 + lVar7),
                              ZEXT416((uint)(fVar19 * *(float *)(pcVar4 + lVar7 + 0xc))),0x30);
      auVar15._0_4_ = auVar10._0_4_ * 0.0 + auVar20._0_4_ * 0.5 + auVar16._0_4_ * 0.0;
      auVar15._4_4_ = auVar10._4_4_ * 0.0 + auVar20._4_4_ * 0.5 + auVar16._4_4_ * 0.0;
      auVar15._8_4_ = auVar10._8_4_ * 0.0 + auVar20._8_4_ * 0.5 + auVar16._8_4_ * 0.0;
      auVar15._12_4_ = auVar10._12_4_ * 0.0 + auVar20._12_4_ * 0.5 + auVar16._12_4_ * 0.0;
      auVar22._0_4_ = auVar13._0_4_ * 0.5;
      auVar22._4_4_ = auVar13._4_4_ * 0.5;
      auVar22._8_4_ = auVar13._8_4_ * 0.5;
      auVar22._12_4_ = auVar13._12_4_ * 0.5;
      auVar20 = vsubps_avx(auVar15,auVar22);
      auVar13 = vshufps_avx(auVar20,auVar20,0xc9);
      auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
      auVar16._0_4_ = auVar20._0_4_ * auVar10._0_4_;
      auVar16._4_4_ = auVar20._4_4_ * auVar10._4_4_;
      auVar16._8_4_ = auVar20._8_4_ * auVar10._8_4_;
      auVar16._12_4_ = auVar20._12_4_ * auVar10._12_4_;
      auVar23._0_4_ = auVar13._0_4_ * auVar9._0_4_;
      auVar23._4_4_ = auVar13._4_4_ * auVar9._4_4_;
      auVar23._8_4_ = auVar13._8_4_ * auVar9._8_4_;
      auVar23._12_4_ = auVar13._12_4_ * auVar9._12_4_;
      auVar13 = vsubps_avx(auVar23,auVar16);
      auVar13 = vshufps_avx(auVar13,auVar13,0xc9);
    }
    else {
      auVar13 = ZEXT816(0x3f80000000000000);
      auVar9 = _DAT_01fec700;
    }
    auVar10 = vdpps_avx(auVar13,auVar13,0x7f);
    if (auVar10._0_4_ <= 1e-18) {
      auVar10 = vshufpd_avx(auVar9,auVar9,1);
      auVar13 = vmovshdup_avx(auVar9);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar24._0_4_ = auVar13._0_4_ ^ 0x80000000;
      auVar13 = vunpckhps_avx(auVar9,ZEXT816(0) << 0x40);
      auVar24._4_12_ = ZEXT812(0) << 0x20;
      auVar16 = vshufps_avx(auVar13,auVar24,0x41);
      auVar18._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar18._8_8_ = auVar10._8_8_ ^ auVar27._8_8_;
      auVar20 = vinsertps_avx(auVar18,auVar9,0x2a);
      auVar13 = vdpps_avx(auVar16,auVar16,0x7f);
      auVar10 = vdpps_avx(auVar20,auVar20,0x7f);
      auVar13 = vcmpps_avx(auVar10,auVar13,1);
      auVar13 = vshufps_avx(auVar13,auVar13,0);
      auVar13 = vblendvps_avx(auVar20,auVar16,auVar13);
      auVar10 = vdpps_avx(auVar13,auVar13,0x7f);
      auVar20 = vrsqrtss_avx(auVar10,auVar10);
      fVar19 = auVar20._0_4_;
      auVar10 = ZEXT416((uint)(fVar19 * 1.5 - auVar10._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
      auVar10 = vshufps_avx(auVar10,auVar10,0);
      aVar14._0_4_ = auVar13._0_4_ * auVar10._0_4_;
      aVar14._4_4_ = auVar13._4_4_ * auVar10._4_4_;
      aVar14._8_4_ = auVar13._8_4_ * auVar10._8_4_;
      aVar14._12_4_ = auVar13._12_4_ * auVar10._12_4_;
      auVar13 = vshufps_avx((undefined1  [16])aVar14,(undefined1  [16])aVar14,0xc9);
      auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
      auVar28._0_4_ = auVar10._0_4_ * aVar14._0_4_;
      auVar28._4_4_ = auVar10._4_4_ * aVar14._4_4_;
      auVar28._8_4_ = auVar10._8_4_ * aVar14._8_4_;
      auVar28._12_4_ = auVar10._12_4_ * aVar14._12_4_;
      auVar25._0_4_ = auVar9._0_4_ * auVar13._0_4_;
      auVar25._4_4_ = auVar9._4_4_ * auVar13._4_4_;
      auVar25._8_4_ = auVar9._8_4_ * auVar13._8_4_;
      auVar25._12_4_ = auVar9._12_4_ * auVar13._12_4_;
      auVar13 = vsubps_avx(auVar25,auVar28);
      auVar20 = vshufps_avx(auVar13,auVar13,0xc9);
      auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
      auVar10 = vrsqrtss_avx(auVar13,auVar13);
      fVar19 = auVar10._0_4_;
      auVar13 = ZEXT416((uint)(fVar19 * 1.5 - auVar13._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
      auVar13 = vshufps_avx(auVar13,auVar13,0);
      aVar21._0_4_ = auVar13._0_4_ * auVar20._0_4_;
      aVar21._4_4_ = auVar13._4_4_ * auVar20._4_4_;
      aVar21._8_4_ = auVar13._8_4_ * auVar20._8_4_;
      aVar21._12_4_ = auVar13._12_4_ * auVar20._12_4_;
    }
    else {
      auVar20 = vrsqrtss_avx(auVar10,auVar10);
      fVar19 = auVar20._0_4_;
      auVar10 = ZEXT416((uint)(fVar19 * 1.5 - auVar10._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
      auVar10 = vshufps_avx(auVar10,auVar10,0);
      aVar21._0_4_ = auVar13._0_4_ * auVar10._0_4_;
      aVar21._4_4_ = auVar13._4_4_ * auVar10._4_4_;
      aVar21._8_4_ = auVar13._8_4_ * auVar10._8_4_;
      aVar21._12_4_ = auVar13._12_4_ * auVar10._12_4_;
      auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
      auVar10 = vshufps_avx((undefined1  [16])aVar21,(undefined1  [16])aVar21,0xc9);
      auVar26._0_4_ = auVar9._0_4_ * auVar10._0_4_;
      auVar26._4_4_ = auVar9._4_4_ * auVar10._4_4_;
      auVar26._8_4_ = auVar9._8_4_ * auVar10._8_4_;
      auVar26._12_4_ = auVar9._12_4_ * auVar10._12_4_;
      auVar17._0_4_ = auVar13._0_4_ * aVar21._0_4_;
      auVar17._4_4_ = auVar13._4_4_ * aVar21._4_4_;
      auVar17._8_4_ = auVar13._8_4_ * aVar21._8_4_;
      auVar17._12_4_ = auVar13._12_4_ * aVar21._12_4_;
      auVar13 = vsubps_avx(auVar17,auVar26);
      auVar20 = vshufps_avx(auVar13,auVar13,0xc9);
      auVar13 = vdpps_avx(auVar20,auVar20,0x7f);
      auVar10 = vrsqrtss_avx(auVar13,auVar13);
      fVar19 = auVar10._0_4_;
      auVar13 = ZEXT416((uint)(fVar19 * 1.5 - auVar13._0_4_ * 0.5 * fVar19 * fVar19 * fVar19));
      auVar13 = vshufps_avx(auVar13,auVar13,0);
      aVar14._0_4_ = auVar13._0_4_ * auVar20._0_4_;
      aVar14._4_4_ = auVar13._4_4_ * auVar20._4_4_;
      aVar14._8_4_ = auVar13._8_4_ * auVar20._8_4_;
      aVar14._12_4_ = auVar13._12_4_ * auVar20._12_4_;
    }
  }
  (__return_storage_ptr__->vx).field_0 = aVar14;
  (__return_storage_ptr__->vy).field_0 = aVar21;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar9;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }